

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

int EmitParameter(VMFunctionBuilder *build,FxExpression *operand,FScriptPosition *pos)

{
  int opb;
  ExpEmit reg;
  uint uVar1;
  ExpEmit where;
  undefined4 extraout_var;
  
  reg._0_4_ = (*operand->_vptr_FxExpression[9])(operand,build);
  reg.Konst = (bool)(char)extraout_var;
  reg.Fixed = (bool)(char)((uint)extraout_var >> 8);
  reg.Final = (bool)(char)((uint)extraout_var >> 0x10);
  reg.Target = (bool)(char)((uint)extraout_var >> 0x18);
  where = reg;
  if ((reg._0_4_ & 0xff0000) == 0x800000) {
    FScriptPosition::Message(pos,2,"Attempted to pass a non-value");
    VMFunctionBuilder::Emit(build,0x46,0,0x80,reg._0_4_ & 0xffff);
    uVar1 = 1;
  }
  else {
    uVar1 = reg._0_4_ >> 0x18;
    opb = EncodeRegType(reg);
    VMFunctionBuilder::Emit(build,0x46,0,opb,reg._0_4_ & 0xffff);
    ExpEmit::Free(&where,build);
  }
  return uVar1;
}

Assistant:

static int EmitParameter(VMFunctionBuilder *build, FxExpression *operand, const FScriptPosition &pos)
{
	ExpEmit where = operand->Emit(build);

	if (where.RegType == REGT_NIL)
	{
		pos.Message(MSG_ERROR, "Attempted to pass a non-value");
		build->Emit(OP_PARAM, 0, where.RegType, where.RegNum);
		return 1;
	}
	else
	{
		build->Emit(OP_PARAM, 0, EncodeRegType(where), where.RegNum);
		where.Free(build);
		return where.RegCount;
	}
}